

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O1

GraphicsAdapterInfo *
Diligent::anon_unknown_0::GetPhysicalDeviceGraphicsAdapterInfo
          (GraphicsAdapterInfo *__return_storage_ptr__,VulkanPhysicalDevice *PhysicalDevice)

{
  RAY_TRACING_CAP_FLAGS *pRVar1;
  byte *pbVar2;
  SHADING_RATE_CAP_FLAGS *pSVar3;
  SPARSE_RESOURCE_CAP_FLAGS *pSVar4;
  char cVar5;
  SHADING_RATE_CAP_FLAGS SVar6;
  uint32_t uVar7;
  VkBool32 VVar8;
  VkBool32 VVar9;
  VkDeviceSize VVar10;
  pointer pVVar11;
  VkPhysicalDeviceFragmentShadingRateKHR *pVVar12;
  pointer pVVar13;
  BIND_FLAGS *pBVar14;
  ADAPTER_TYPE AVar15;
  ADAPTER_VENDOR AVar16;
  uchar uVar17;
  SAMPLE_COUNT SVar18;
  SHADING_RATE SVar19;
  COMMAND_QUEUE_TYPE CVar20;
  SHADER_TYPE SVar21;
  WAVE_FEATURE WVar22;
  VkResult VVar23;
  size_t i;
  ulong uVar24;
  SHADING_RATE_COMBINER SVar25;
  uint uVar26;
  uint uVar27;
  VkPhysicalDeviceFragmentShadingRateKHR *SR;
  long lVar28;
  VkPhysicalDeviceFragmentShadingRateKHR *Args_1;
  int iVar29;
  ulong uVar30;
  VkFormat VVar31;
  ulong uVar32;
  CPU_ACCESS_FLAGS CVar33;
  ulong uVar34;
  Uint64 UVar35;
  Uint64 UVar36;
  Uint64 UVar37;
  ulong uVar38;
  BIND_FLAGS *pBVar39;
  ulong uVar40;
  unsigned_long *Src;
  VkMemoryHeap *pVVar41;
  Uint32 *pUVar42;
  bool bVar43;
  string msg;
  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
  ShadingRates;
  Uint32 ShadingRateCount;
  undefined1 local_a8 [48];
  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
  local_78;
  unsigned_long local_58;
  BIND_FLAGS *local_50;
  BIND_FLAGS *local_48;
  VkPhysicalDeviceProperties *local_40;
  ExtensionProperties *local_38;
  
  local_50 = &(__return_storage_ptr__->Memory).MemorylessTextureBindFlags;
  (__return_storage_ptr__->Sampler).BorderSamplingModeSupported = false;
  __return_storage_ptr__->VendorId = 0;
  __return_storage_ptr__->DeviceId = 0;
  *(undefined8 *)&__return_storage_ptr__->NumOutputs = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Memory).LocalMemory + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Memory).HostVisibleMemory + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Memory).UnifiedMemory + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Memory).MaxMemoryAllocation + 1) = 0;
  *(undefined8 *)&(__return_storage_ptr__->Memory).MemorylessTextureBindFlags = 0;
  (__return_storage_ptr__->RayTracing).ShaderGroupHandleSize = 0;
  (__return_storage_ptr__->RayTracing).MaxShaderRecordStride = 0;
  (__return_storage_ptr__->RayTracing).ShaderGroupBaseAlignment = 0;
  (__return_storage_ptr__->RayTracing).MaxRayGenThreads = 0;
  (__return_storage_ptr__->RayTracing).MaxInstancesPerTLAS = 0;
  (__return_storage_ptr__->RayTracing).MaxPrimitivesPerBLAS = 0;
  (__return_storage_ptr__->RayTracing).MaxGeometriesPerBLAS = 0;
  (__return_storage_ptr__->RayTracing).VertexBufferAlignment = 0;
  (__return_storage_ptr__->RayTracing).IndexBufferAlignment = 0;
  (__return_storage_ptr__->RayTracing).TransformBufferAlignment = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->RayTracing).TransformBufferAlignment + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->RayTracing).ScratchBufferAlignment + 1) = 0;
  (__return_storage_ptr__->WaveOp).MinSize = 0;
  (__return_storage_ptr__->WaveOp).MaxSize = 0;
  (__return_storage_ptr__->WaveOp).SupportedStages = SHADER_TYPE_UNKNOWN;
  (__return_storage_ptr__->WaveOp).Features = WAVE_FEATURE_UNKNOWN;
  (__return_storage_ptr__->Buffer).ConstantBufferOffsetAlignment = 0;
  (__return_storage_ptr__->Buffer).StructuredBufferOffsetAlignment = 0;
  (__return_storage_ptr__->Texture).MaxTexture1DDimension = 0;
  (__return_storage_ptr__->Texture).MaxTexture1DArraySlices = 0;
  (__return_storage_ptr__->Texture).MaxTexture2DDimension = 0;
  (__return_storage_ptr__->Texture).MaxTexture2DArraySlices = 0;
  (__return_storage_ptr__->Texture).MaxTexture3DDimension = 0;
  (__return_storage_ptr__->Texture).MaxTextureCubeDimension = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Texture).MaxTextureCubeDimension + 1) = 0;
  memset(__return_storage_ptr__,0,0x82);
  (__return_storage_ptr__->Sampler).MaxAnisotropy = '\x01';
  (__return_storage_ptr__->Sampler).LODBiasSupported = false;
  (__return_storage_ptr__->ShadingRate).CapFlags = SHADING_RATE_CAP_FLAG_NONE;
  (__return_storage_ptr__->ShadingRate).Combiners = SHADING_RATE_COMBINER_PASSTHROUGH;
  (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_UNKNOWN;
  (__return_storage_ptr__->MeshShader).MaxThreadGroupCountX = 0;
  (__return_storage_ptr__->MeshShader).MaxThreadGroupCountY = 0;
  (__return_storage_ptr__->MeshShader).MaxThreadGroupCountZ = 0;
  (__return_storage_ptr__->MeshShader).MaxThreadGroupTotalCount = 0;
  (__return_storage_ptr__->ShadingRate).ShadingRates[0].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[0].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[1].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[1].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[2].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[2].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[3].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[3].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[4].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[4].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[5].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[5].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[6].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[6].SampleBits = SAMPLE_COUNT_NONE;
  (__return_storage_ptr__->ShadingRate).ShadingRates[7].Rate = SHADING_RATE_1X1;
  (__return_storage_ptr__->ShadingRate).ShadingRates[7].SampleBits = SAMPLE_COUNT_NONE;
  *(undefined4 *)&(__return_storage_ptr__->ShadingRate).ShadingRates[7].SampleBits = 0;
  (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
       SHADING_RATE_TEXTURE_ACCESS_UNKNOWN;
  local_48 = &(__return_storage_ptr__->ShadingRate).BindFlags;
  (__return_storage_ptr__->ShadingRate).BindFlags = BIND_NONE;
  (__return_storage_ptr__->ShadingRate).MinTileSize[0] = 0;
  *(undefined8 *)((__return_storage_ptr__->ShadingRate).MinTileSize + 1) = 0;
  *(undefined8 *)((__return_storage_ptr__->ShadingRate).MaxTileSize + 1) = 0;
  (__return_storage_ptr__->ComputeShader).SharedMemorySize = 0;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupInvocations = 0;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeX = 0;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeY = 0;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeZ = 0;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountX = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeZ + 2) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->ComputeShader).MaxThreadGroupCountY + 2) = 0;
  (__return_storage_ptr__->DrawCommand).MaxIndexValue = 0;
  (__return_storage_ptr__->DrawCommand).MaxDrawIndirectCount = 0;
  (__return_storage_ptr__->SparseResources).AddressSpaceSize = 0;
  (__return_storage_ptr__->SparseResources).ResourceSpaceSize = 0;
  (__return_storage_ptr__->SparseResources).CapFlags = SPARSE_RESOURCE_CAP_FLAG_NONE;
  (__return_storage_ptr__->SparseResources).StandardBlockSize = 0;
  (__return_storage_ptr__->SparseResources).BufferBindFlags = BIND_NONE;
  (__return_storage_ptr__->SparseResources)._Padding = 0;
  (__return_storage_ptr__->Features).SeparablePrograms = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderResourceQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).WireframeFill = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).MultithreadedResourceCreation = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ComputeShaders = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).GeometryShaders = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).Tessellation = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).RayTracing = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).VertexPipelineUAVWritesAndAtomics =
       DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).NativeFence = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).SparseResources = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).AsyncShaderCompilation = DEVICE_FEATURE_STATE_DISABLED;
  (__return_storage_ptr__->Features).FormattedBuffers = DEVICE_FEATURE_STATE_DISABLED;
  lVar28 = 0;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->Queues[0].TextureCopyGranularity + lVar28 + -8) =
         0;
    *(undefined4 *)((long)__return_storage_ptr__->Queues[0].TextureCopyGranularity + lVar28 + -4) =
         0;
    *(undefined4 *)((long)__return_storage_ptr__->Queues[0].TextureCopyGranularity + lVar28 + 8) = 0
    ;
    *(undefined8 *)((long)__return_storage_ptr__->Queues[0].TextureCopyGranularity + lVar28) = 0;
    lVar28 = lVar28 + 0x14;
  } while (lVar28 != 0x140);
  __return_storage_ptr__->NumQueues = 0;
  uVar7 = PhysicalDevice->m_VkVersion;
  local_40 = &PhysicalDevice->m_Properties;
  local_38 = &PhysicalDevice->m_ExtProperties;
  lVar28 = 0;
  do {
    cVar5 = (PhysicalDevice->m_Properties).deviceName[lVar28];
    if (cVar5 == '\0') break;
    __return_storage_ptr__->Description[lVar28] = cVar5;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x7f);
  AVar15 = VkPhysicalDeviceTypeToAdapterType((PhysicalDevice->m_Properties).deviceType);
  __return_storage_ptr__->Type = AVar15;
  AVar16 = VendorIdToAdapterVendor((PhysicalDevice->m_Properties).vendorID);
  __return_storage_ptr__->Vendor = AVar16;
  __return_storage_ptr__->VendorId = (PhysicalDevice->m_Properties).vendorID;
  __return_storage_ptr__->DeviceId = (PhysicalDevice->m_Properties).deviceID;
  __return_storage_ptr__->NumOutputs = 0;
  VkFeaturesToDeviceFeatures
            ((DeviceFeatures *)local_a8,uVar7,&PhysicalDevice->m_Features,local_40,
             &PhysicalDevice->m_ExtFeatures,local_38,DEVICE_FEATURE_STATE_OPTIONAL);
  pBVar39 = local_50;
  (__return_storage_ptr__->Features).UniformBuffer8BitAccess = local_a8[0x1f];
  (__return_storage_ptr__->Features).ShaderResourceStaticArrays = (char)local_a8._32_7_;
  (__return_storage_ptr__->Features).ShaderResourceRuntimeArrays = SUB71(local_a8._32_7_,1);
  (__return_storage_ptr__->Features).WaveOp = SUB71(local_a8._32_7_,2);
  (__return_storage_ptr__->Features).InstanceDataStepRate = SUB71(local_a8._32_7_,3);
  (__return_storage_ptr__->Features).NativeFence = SUB71(local_a8._32_7_,4);
  (__return_storage_ptr__->Features).TileShaders = SUB71(local_a8._32_7_,5);
  (__return_storage_ptr__->Features).TransferQueueTimestampQueries = SUB71(local_a8._32_7_,6);
  (__return_storage_ptr__->Features).VariableRateShading = local_a8[0x27];
  (__return_storage_ptr__->Features).SparseResources = local_a8[0x28];
  (__return_storage_ptr__->Features).SubpassFramebufferFetch = local_a8[0x29];
  (__return_storage_ptr__->Features).TextureComponentSwizzle = local_a8[0x2a];
  (__return_storage_ptr__->Features).TextureSubresourceViews = local_a8[0x2b];
  (__return_storage_ptr__->Features).NativeMultiDraw = local_a8[0x2c];
  (__return_storage_ptr__->Features).AsyncShaderCompilation = local_a8[0x2d];
  (__return_storage_ptr__->Features).FormattedBuffers = local_a8[0x2e];
  (__return_storage_ptr__->Features).DepthClamp = local_a8[0x10];
  (__return_storage_ptr__->Features).IndependentBlend = local_a8[0x11];
  (__return_storage_ptr__->Features).DualSourceBlend = local_a8[0x12];
  (__return_storage_ptr__->Features).MultiViewport = local_a8[0x13];
  (__return_storage_ptr__->Features).TextureCompressionBC = local_a8[0x14];
  (__return_storage_ptr__->Features).TextureCompressionETC2 = local_a8[0x15];
  (__return_storage_ptr__->Features).VertexPipelineUAVWritesAndAtomics = local_a8[0x16];
  (__return_storage_ptr__->Features).PixelUAVWritesAndAtomics = local_a8[0x17];
  (__return_storage_ptr__->Features).TextureUAVExtendedFormats = (char)local_a8._24_7_;
  (__return_storage_ptr__->Features).ShaderFloat16 = SUB71(local_a8._24_7_,1);
  (__return_storage_ptr__->Features).ResourceBuffer16BitAccess = SUB71(local_a8._24_7_,2);
  (__return_storage_ptr__->Features).UniformBuffer16BitAccess = SUB71(local_a8._24_7_,3);
  (__return_storage_ptr__->Features).ShaderInputOutput16 = SUB71(local_a8._24_7_,4);
  (__return_storage_ptr__->Features).ShaderInt8 = SUB71(local_a8._24_7_,5);
  (__return_storage_ptr__->Features).ResourceBuffer8BitAccess = SUB71(local_a8._24_7_,6);
  (__return_storage_ptr__->Features).UniformBuffer8BitAccess = local_a8[0x1f];
  (__return_storage_ptr__->Features).SeparablePrograms = local_a8[0];
  (__return_storage_ptr__->Features).ShaderResourceQueries = local_a8[1];
  (__return_storage_ptr__->Features).WireframeFill = local_a8[2];
  (__return_storage_ptr__->Features).MultithreadedResourceCreation = local_a8[3];
  (__return_storage_ptr__->Features).ComputeShaders = local_a8[4];
  (__return_storage_ptr__->Features).GeometryShaders = local_a8[5];
  (__return_storage_ptr__->Features).Tessellation = local_a8[6];
  (__return_storage_ptr__->Features).MeshShaders = local_a8[7];
  (__return_storage_ptr__->Features).RayTracing = local_a8[8];
  (__return_storage_ptr__->Features).BindlessResources = local_a8[9];
  (__return_storage_ptr__->Features).OcclusionQueries = local_a8[10];
  (__return_storage_ptr__->Features).BinaryOcclusionQueries = local_a8[0xb];
  (__return_storage_ptr__->Features).TimestampQueries = local_a8[0xc];
  (__return_storage_ptr__->Features).PipelineStatisticsQueries = local_a8[0xd];
  (__return_storage_ptr__->Features).DurationQueries = local_a8[0xe];
  (__return_storage_ptr__->Features).DepthBiasClamp = local_a8[0xf];
  (__return_storage_ptr__->Buffer).ConstantBufferOffsetAlignment =
       (Uint32)(PhysicalDevice->m_Properties).limits.minUniformBufferOffsetAlignment;
  (__return_storage_ptr__->Buffer).StructuredBufferOffsetAlignment =
       (Uint32)(PhysicalDevice->m_Properties).limits.minStorageBufferOffsetAlignment;
  (__return_storage_ptr__->Texture).MaxTexture1DDimension =
       (PhysicalDevice->m_Properties).limits.maxImageDimension1D;
  uVar7 = (PhysicalDevice->m_Properties).limits.maxImageArrayLayers;
  (__return_storage_ptr__->Texture).MaxTexture1DArraySlices = uVar7;
  (__return_storage_ptr__->Texture).MaxTexture2DDimension =
       (PhysicalDevice->m_Properties).limits.maxImageDimension2D;
  (__return_storage_ptr__->Texture).MaxTexture2DArraySlices = uVar7;
  (__return_storage_ptr__->Texture).MaxTexture3DDimension =
       (PhysicalDevice->m_Properties).limits.maxImageDimension3D;
  (__return_storage_ptr__->Texture).MaxTextureCubeDimension =
       (PhysicalDevice->m_Properties).limits.maxImageDimensionCube;
  (__return_storage_ptr__->Texture).Texture2DMSSupported = true;
  (__return_storage_ptr__->Texture).Texture2DMSArraySupported = true;
  (__return_storage_ptr__->Texture).TextureViewSupported = true;
  (__return_storage_ptr__->Texture).CubemapArraysSupported =
       (PhysicalDevice->m_Features).imageCubeArray != 0;
  (__return_storage_ptr__->Texture).TextureView2DOn3DSupported =
       (Bool)((PhysicalDevice->m_ExtFeatures).HasPortabilitySubset ^ 1U |
             (PhysicalDevice->m_ExtFeatures).PortabilitySubset.imageView2DOn3DImage == 1);
  (__return_storage_ptr__->Sampler).BorderSamplingModeSupported = true;
  uVar26 = (uint)(PhysicalDevice->m_Properties).limits.maxSamplerAnisotropy;
  Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)(ulong)uVar26;
  (__return_storage_ptr__->Sampler).MaxAnisotropy = (Uint8)uVar26;
  (__return_storage_ptr__->Sampler).LODBiasSupported = true;
  if ((__return_storage_ptr__->Features).RayTracing != DEVICE_FEATURE_STATE_DISABLED) {
    (__return_storage_ptr__->RayTracing).MaxRecursionDepth =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxRayRecursionDepth;
    (__return_storage_ptr__->RayTracing).ShaderGroupHandleSize =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.shaderGroupHandleSize;
    (__return_storage_ptr__->RayTracing).MaxShaderRecordStride =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxShaderGroupStride;
    (__return_storage_ptr__->RayTracing).ShaderGroupBaseAlignment =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.shaderGroupBaseAlignment;
    (__return_storage_ptr__->RayTracing).MaxRayGenThreads =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxRayDispatchInvocationCount;
    (__return_storage_ptr__->RayTracing).MaxInstancesPerTLAS =
         (Uint32)(PhysicalDevice->m_ExtProperties).AccelStruct.maxInstanceCount;
    (__return_storage_ptr__->RayTracing).MaxPrimitivesPerBLAS =
         (Uint32)(PhysicalDevice->m_ExtProperties).AccelStruct.maxPrimitiveCount;
    (__return_storage_ptr__->RayTracing).MaxGeometriesPerBLAS =
         (Uint32)(PhysicalDevice->m_ExtProperties).AccelStruct.maxGeometryCount;
    (__return_storage_ptr__->RayTracing).VertexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).IndexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).TransformBufferAlignment = 0x10;
    (__return_storage_ptr__->RayTracing).BoxBufferAlignment = 8;
    (__return_storage_ptr__->RayTracing).ScratchBufferAlignment =
         (PhysicalDevice->m_ExtProperties).AccelStruct.
         minAccelerationStructureScratchOffsetAlignment;
    (__return_storage_ptr__->RayTracing).InstanceBufferAlignment = 0x10;
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipeline != 0) {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS;
    }
    if ((PhysicalDevice->m_ExtFeatures).RayQuery.rayQuery != 0) {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING;
    }
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipelineTraceRaysIndirect != 0)
    {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING;
    }
  }
  if ((__return_storage_ptr__->Features).WaveOp != DEVICE_FEATURE_STATE_DISABLED) {
    bVar43 = (PhysicalDevice->m_Features).geometryShader != 0;
    iVar29 = 0x37;
    if ((PhysicalDevice->m_Features).tessellationShader == 0) {
      iVar29 = 0x31;
    }
    uVar27 = iVar29 + (uint)bVar43 * 8;
    Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)(ulong)uVar27;
    uVar26 = iVar29 + 0xc0 + (uint)bVar43 * 8;
    if ((PhysicalDevice->m_ExtFeatures).MeshShader.taskShader == 0) {
      uVar26 = uVar27;
    }
    if ((PhysicalDevice->m_ExtFeatures).MeshShader.meshShader == 0) {
      uVar26 = uVar27;
    }
    uVar27 = uVar26 | 0x3f00;
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipeline == 0) {
      uVar27 = uVar26;
    }
    uVar26 = (PhysicalDevice->m_ExtProperties).Subgroup.supportedStages;
    uVar7 = (PhysicalDevice->m_ExtProperties).Subgroup.subgroupSize;
    (__return_storage_ptr__->WaveOp).MinSize = uVar7;
    (__return_storage_ptr__->WaveOp).MaxSize = uVar7;
    SVar21 = VkShaderStageFlagsToShaderTypes(uVar27 & uVar26);
    (__return_storage_ptr__->WaveOp).SupportedStages = SVar21;
    WVar22 = VkSubgroupFeatureFlagsToWaveFeatures
                       ((PhysicalDevice->m_ExtProperties).Subgroup.supportedOperations);
    (__return_storage_ptr__->WaveOp).Features = WVar22;
  }
  if ((__return_storage_ptr__->Features).MeshShaders != DEVICE_FEATURE_STATE_DISABLED) {
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountX =
         (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[0];
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountY =
         (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[1];
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountZ =
         (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[2];
    (__return_storage_ptr__->MeshShader).MaxThreadGroupTotalCount =
         (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupTotalCount;
  }
  (__return_storage_ptr__->ComputeShader).SharedMemorySize =
       (PhysicalDevice->m_Properties).limits.maxComputeSharedMemorySize;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupInvocations =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupInvocations;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeX =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[0];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeY =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[1];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeZ =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[2];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountX =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[0];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountY =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[1];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountZ =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[2];
  if ((__return_storage_ptr__->Features).VariableRateShading != DEVICE_FEATURE_STATE_DISABLED) {
    VVar8 = (PhysicalDevice->m_ExtFeatures).ShadingRate.pipelineFragmentShadingRate;
    uVar26 = (PhysicalDevice->m_ExtFeatures).ShadingRate.primitiveFragmentShadingRate;
    Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)(ulong)uVar26;
    VVar9 = (PhysicalDevice->m_ExtFeatures).ShadingRate.attachmentFragmentShadingRate;
    if ((VVar8 == 0 && uVar26 == 0) && VVar9 == 0) {
      if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMap != 0) {
        (__return_storage_ptr__->ShadingRate).CapFlags =
             SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
             SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
             SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
        (__return_storage_ptr__->ShadingRate).Combiners =
             SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH;
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_UNORM8;
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x1;
        if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMapDynamic == 0) {
          Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)
                   (ulong)((PhysicalDevice->m_ExtFeatures).FragmentDensityMap2.
                           fragmentDensityMapDeferred == 0 | 2);
        }
        (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
             (SHADING_RATE_TEXTURE_ACCESS)Args_1;
        if ((PhysicalDevice->m_ExtProperties).FragmentDensityMap.fragmentDensityInvocations != 0) {
          (__return_storage_ptr__->ShadingRate).CapFlags =
               SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
               SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS|
               SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
               SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
        }
        if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMapNonSubsampledImages
            != 0) {
          pbVar2 = (byte *)((long)&(__return_storage_ptr__->ShadingRate).CapFlags + 1);
          *pbVar2 = *pbVar2 | 8;
        }
        (__return_storage_ptr__->ShadingRate).MaxSabsampledArraySlices =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap2.maxSubsampledArrayLayers;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap.minFragmentDensityTexelSize.width;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap.minFragmentDensityTexelSize.height
        ;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap.maxFragmentDensityTexelSize.width;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap.maxFragmentDensityTexelSize.height
        ;
        (__return_storage_ptr__->ShadingRate).NumShadingRates = '\x01';
        (__return_storage_ptr__->ShadingRate).ShadingRates[0].Rate = SHADING_RATE_1X1;
        (__return_storage_ptr__->ShadingRate).ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
      }
    }
    else {
      if (VVar8 != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_PER_DRAW;
      }
      if (uVar26 != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE;
      }
      if (VVar9 != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateWithSampleMask != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_SAMPLE_MASK;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateWithShaderSampleMask != 0
         ) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.
          fragmentShadingRateWithShaderDepthStencilWrites != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 = (char)*pSVar3 | SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.
          primitiveFragmentShadingRateWithMultipleViewports != 0) {
        pSVar3 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar3 =
             (char)*pSVar3 | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.layeredShadingRateAttachments != 0) {
        pbVar2 = (byte *)((long)&(__return_storage_ptr__->ShadingRate).CapFlags + 1);
        *pbVar2 = *pbVar2 | 1;
      }
      SVar6 = (__return_storage_ptr__->ShadingRate).CapFlags;
      Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)(ulong)SVar6;
      if ((SVar6 & SHADING_RATE_CAP_FLAG_TEXTURE_BASED) != SHADING_RATE_CAP_FLAG_NONE) {
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)(ulong)(SVar6 | 0x800);
        (__return_storage_ptr__->ShadingRate).CapFlags = (SHADING_RATE_CAP_FLAGS)(SVar6 | 0x800);
      }
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->ShadingRate).CapFlags + 1);
      *pbVar2 = *pbVar2 | 2;
      (__return_storage_ptr__->ShadingRate).Combiners =
           SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH;
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateNonTrivialCombinerOps !=
          0) {
        (__return_storage_ptr__->ShadingRate).Combiners =
             SHADING_RATE_COMBINER_MAX|SHADING_RATE_COMBINER_MIN|SHADING_RATE_COMBINER_OVERRIDE|
             SHADING_RATE_COMBINER_PASSTHROUGH;
        SVar25 = ((PhysicalDevice->m_ExtProperties).ShadingRate.
                  fragmentShadingRateStrictMultiplyCombiner != 0) * '\x10' +
                 (SHADING_RATE_COMBINER_SUM|SHADING_RATE_COMBINER_MAX|SHADING_RATE_COMBINER_MIN|
                  SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH);
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)
                 CONCAT71((int7)((ulong)Args_1 >> 8),SVar25);
        (__return_storage_ptr__->ShadingRate).Combiners = SVar25;
      }
      if (VVar9 != 0) {
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_PALETTE;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] =
             (PhysicalDevice->m_ExtProperties).ShadingRate.minFragmentShadingRateAttachmentTexelSize
             .width;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] =
             (PhysicalDevice->m_ExtProperties).ShadingRate.minFragmentShadingRateAttachmentTexelSize
             .height;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] =
             (PhysicalDevice->m_ExtProperties).ShadingRate.maxFragmentShadingRateAttachmentTexelSize
             .width;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] =
             (PhysicalDevice->m_ExtProperties).ShadingRate.maxFragmentShadingRateAttachmentTexelSize
             .height;
      }
      local_78.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
      local_78.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
      local_78.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58 = local_58 & 0xffffffff00000000;
      (*vkGetPhysicalDeviceFragmentShadingRatesKHR)
                (PhysicalDevice->m_VkDevice,(uint32_t *)&local_58,
                 (VkPhysicalDeviceFragmentShadingRateKHR *)0x0);
      if ((uint)local_58 < 3) {
        FormatString<char[26],char[22]>
                  ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ShadingRateCount >= 3",(char (*) [22])Args_1);
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x15d;
        DebugAssertionFailed
                  ((Char *)local_a8._0_8_,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x15d);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
      }
      std::
      vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::resize(&local_78,local_58 & 0xffffffff);
      pVVar12 = local_78.
                super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (pVVar12 !=
             local_78.
             super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pVVar12->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
        Args_1 = pVVar12 + 1;
        pVVar12 = Args_1;
      }
      (*vkGetPhysicalDeviceFragmentShadingRatesKHR)
                (PhysicalDevice->m_VkDevice,(uint32_t *)&local_58,
                 local_78.
                 super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_a8._0_8_ =
           (long)local_78.
                 super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78.
                 super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      local_58 = 9;
      Src = &local_58;
      if ((ulong)local_a8._0_8_ < (Char *)0xa) {
        Src = (unsigned_long *)local_a8;
      }
      uVar17 = StaticCast<unsigned_char,unsigned_long>(Src);
      (__return_storage_ptr__->ShadingRate).NumShadingRates = uVar17;
      if (uVar17 != '\0') {
        lVar28 = 0x10;
        uVar40 = 0;
        do {
          pVVar13 = local_78.
                    super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)(&(local_78.
                           super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar28) != 1) ||
              (*(int *)((long)&(local_78.
                                super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pNext + lVar28) != 1))
             && ((PhysicalDevice->m_ExtProperties).ShadingRate.
                 maxFragmentShadingRateRasterizationSamples * 2 - 1 <
                 *(uint *)((long)&(local_78.
                                   super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->sType + lVar28))) {
            FormatString<char[26],char[201]>
                      ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "(Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) || (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1))"
                       ,(char (*) [201])Args_1);
            Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x172;
            DebugAssertionFailed
                      ((Char *)local_a8._0_8_,"GetPhysicalDeviceGraphicsAdapterInfo",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                       ,0x172);
            if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
          }
          SVar18 = VkSampleCountFlagsToSampleCount(*(uint *)((long)&pVVar13->sType + lVar28) & 0x7f)
          ;
          (__return_storage_ptr__->ShadingRate).ShadingRates[uVar40].SampleBits = SVar18;
          SVar19 = VkFragmentSizeToShadingRate((VkExtent2D *)(&pVVar13->field_0x4 + lVar28));
          (__return_storage_ptr__->ShadingRate).ShadingRates[uVar40].Rate = SVar19;
          uVar40 = uVar40 + 1;
          lVar28 = lVar28 + 0x20;
        } while (uVar40 < (__return_storage_ptr__->ShadingRate).NumShadingRates);
      }
      pBVar39 = local_50;
      if (local_78.
          super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
          ._M_impl.super__Vector_impl_data._M_start != (VkPhysicalDeviceFragmentShadingRateKHR *)0x0
         ) {
        operator_delete(local_78.
                        super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        pBVar39 = local_50;
      }
    }
    if (((__return_storage_ptr__->ShadingRate).CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED) !=
        SHADING_RATE_CAP_FLAG_NONE) {
      bVar43 = (__return_storage_ptr__->ShadingRate).Format == SHADING_RATE_FORMAT_UNORM8;
      VVar31 = (uint)bVar43 * 3 + VK_FORMAT_R8_UINT;
      local_78.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_78.
                            super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      local_78.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
      (*vkGetPhysicalDeviceFormatProperties)
                (PhysicalDevice->m_VkDevice,VVar31,(VkFormatProperties *)&local_78);
      if (((ulong)local_78.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0x4100000000000000) == 0) {
        FormatString<char[26],char[145]>
                  ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT)"
                   ,(char (*) [145])Args_1);
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x1b5;
        DebugAssertionFailed
                  ((Char *)local_a8._0_8_,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x1b5);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
      }
      pBVar14 = local_48;
      uVar26 = (uint)bVar43 * 0x100 + 0x100;
      *local_48 = BIND_FLAG_LAST;
      if (((ulong)local_78.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0x100000000) != 0) {
        local_a8._16_8_ = 0;
        local_a8[0x18] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x19] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1a] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1b] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1c] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1d] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1e] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1f] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8._0_8_ = (Char *)0x0;
        local_a8._8_8_ = 0;
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
        VVar23 = (*vkGetPhysicalDeviceImageFormatProperties)
                           (PhysicalDevice->m_VkDevice,VVar31,VK_IMAGE_TYPE_2D,
                            VK_IMAGE_TILING_OPTIMAL,uVar26 | 4,0,(VkImageFormatProperties *)local_a8
                           );
        if (VVar23 == VK_SUCCESS) {
          *(undefined1 *)pBVar14 = (char)*pBVar14 | BIND_SHADER_RESOURCE;
        }
      }
      if (((ulong)local_78.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0x200000000) != 0) {
        local_a8._16_8_ = 0;
        local_a8[0x18] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x19] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1a] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1b] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1c] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1d] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1e] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1f] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8._0_8_ = (Char *)0x0;
        local_a8._8_8_ = 0;
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
        VVar23 = (*vkGetPhysicalDeviceImageFormatProperties)
                           (PhysicalDevice->m_VkDevice,VVar31,VK_IMAGE_TYPE_2D,
                            VK_IMAGE_TILING_OPTIMAL,uVar26 | 8,0,(VkImageFormatProperties *)local_a8
                           );
        if (VVar23 == VK_SUCCESS) {
          *(undefined1 *)pBVar14 = (char)*pBVar14 | BIND_UNORDERED_ACCESS;
        }
      }
      if (((ulong)local_78.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0x8000000000) != 0) {
        local_a8._16_8_ = 0;
        local_a8[0x18] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x19] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1a] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1b] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1c] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1d] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1e] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8[0x1f] = DEVICE_FEATURE_STATE_DISABLED;
        local_a8._0_8_ = (Char *)0x0;
        local_a8._8_8_ = 0;
        Args_1 = (VkPhysicalDeviceFragmentShadingRateKHR *)0x0;
        VVar23 = (*vkGetPhysicalDeviceImageFormatProperties)
                           (PhysicalDevice->m_VkDevice,VVar31,VK_IMAGE_TYPE_2D,
                            VK_IMAGE_TILING_OPTIMAL,uVar26 | 0x10,0,
                            (VkImageFormatProperties *)local_a8);
        if (VVar23 == VK_SUCCESS) {
          *(undefined1 *)pBVar14 = (char)*pBVar14 | BIND_RENDER_TARGET;
        }
      }
    }
  }
  (__return_storage_ptr__->DrawCommand).MaxIndexValue =
       (PhysicalDevice->m_Properties).limits.maxDrawIndexedIndexValue;
  (__return_storage_ptr__->DrawCommand).MaxDrawIndirectCount =
       (PhysicalDevice->m_Properties).limits.maxDrawIndirectCount;
  (__return_storage_ptr__->DrawCommand).CapFlags =
       DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
  if (((PhysicalDevice->m_Features).multiDrawIndirect != 0) ||
     ((PhysicalDevice->m_ExtFeatures).DrawIndirectCount == true)) {
    (__return_storage_ptr__->DrawCommand).CapFlags =
         DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|
         DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
  }
  if ((PhysicalDevice->m_Features).drawIndirectFirstInstance != 0) {
    *(undefined1 *)&(__return_storage_ptr__->DrawCommand).CapFlags =
         (char)(__return_storage_ptr__->DrawCommand).CapFlags |
         DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE;
  }
  if ((PhysicalDevice->m_ExtFeatures).DrawIndirectCount == true) {
    *(undefined1 *)&(__return_storage_ptr__->DrawCommand).CapFlags =
         (char)(__return_storage_ptr__->DrawCommand).CapFlags |
         DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER;
  }
  if ((__return_storage_ptr__->Features).SparseResources != DEVICE_FEATURE_STATE_DISABLED) {
    if (((PhysicalDevice->m_Features).sparseBinding == 0) ||
       ((PhysicalDevice->m_Features).sparseResidencyImage2D == 0 &&
        (PhysicalDevice->m_Features).sparseResidencyBuffer == 0)) {
      FormatString<char[26],char[100]>
                ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D)"
                 ,(char (*) [100])Args_1);
      DebugAssertionFailed
                ((Char *)local_a8._0_8_,"GetPhysicalDeviceGraphicsAdapterInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                 ,0x1d6);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
    }
    VVar10 = (PhysicalDevice->m_Properties).limits.sparseAddressSpaceSize;
    (__return_storage_ptr__->SparseResources).AddressSpaceSize = VVar10;
    (__return_storage_ptr__->SparseResources).ResourceSpaceSize = VVar10;
    (__return_storage_ptr__->SparseResources).StandardBlockSize = 0x10000;
    (__return_storage_ptr__->SparseResources).BufferBindFlags =
         BIND_RAY_TRACING|BIND_INDIRECT_DRAW_ARGS|BIND_UNORDERED_ACCESS|BIND_SHADER_RESOURCE|
         BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER;
    pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 2);
    *pbVar2 = *pbVar2 | 3;
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard2DBlockShape != 0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard2DMultisampleBlockShape !=
        0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 4;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard3DBlockShape != 0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 8;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyAlignedMipSize != 0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 0x10;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyNonResidentStrict != 0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((PhysicalDevice->m_Features).shaderResourceResidency != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyBuffer != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_BUFFER;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyImage2D != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *pSVar4 = *pSVar4 | (SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL|
                          SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
    }
    if ((PhysicalDevice->m_Features).sparseResidencyImage3D != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D;
    }
    if ((PhysicalDevice->m_Features).sparseResidency2Samples != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES;
    }
    if ((PhysicalDevice->m_Features).sparseResidency4Samples != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES;
    }
    if ((PhysicalDevice->m_Features).sparseResidency8Samples != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES;
    }
    if ((PhysicalDevice->m_Features).sparseResidency16Samples != 0) {
      pSVar4 = &(__return_storage_ptr__->SparseResources).CapFlags;
      *(undefined1 *)pSVar4 = (char)*pSVar4 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyAliased != 0) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->SparseResources).CapFlags + 1);
      *pbVar2 = *pbVar2 | 1;
    }
  }
  (__return_storage_ptr__->Memory).LocalMemory = 0;
  (__return_storage_ptr__->Memory).HostVisibleMemory = 0;
  (__return_storage_ptr__->Memory).UnifiedMemory = 0;
  (__return_storage_ptr__->Memory).MaxMemoryAllocation =
       (PhysicalDevice->m_ExtProperties).Maintenance3.maxMemoryAllocationSize;
  uVar40 = (ulong)(PhysicalDevice->m_MemoryProperties).memoryTypeCount;
  if (uVar40 == 0) {
    uVar24 = 0;
    uVar32 = 0;
    uVar30 = 0;
  }
  else {
    CVar33 = (__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess;
    uVar34 = 0;
    uVar30 = 0;
    uVar32 = 0;
    uVar24 = 0;
    do {
      uVar26 = (PhysicalDevice->m_MemoryProperties).memoryTypes[uVar34].propertyFlags;
      if ((uVar26 & 0x10) == 0) {
        if ((~uVar26 & 3) == 0) {
          if ((uVar26 & 4) != 0) {
            CVar33 = CVar33 | CPU_ACCESS_FLAG_LAST;
            (__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess = CVar33;
          }
          uVar30 = uVar30 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                                [uVar34].heapIndex & 0x3f);
          if ((uVar26 & 8) != 0) {
            CVar33 = CVar33 | CPU_ACCESS_READ;
            (__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess = CVar33;
          }
        }
        else if ((uVar26 & 1) == 0) {
          if ((uVar26 & 2) != 0) {
            uVar24 = uVar24 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                                  [uVar34].heapIndex & 0x3f);
          }
        }
        else {
          uVar32 = uVar32 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                                [uVar34].heapIndex & 0x3f);
        }
      }
      else {
        *pBVar39 = BIND_INPUT_ATTACHMENT|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET;
      }
      uVar34 = uVar34 + 1;
    } while (uVar40 != uVar34);
  }
  uVar40 = (ulong)(PhysicalDevice->m_MemoryProperties).memoryHeapCount;
  if (uVar40 != 0) {
    UVar35 = (__return_storage_ptr__->Memory).LocalMemory;
    UVar36 = (__return_storage_ptr__->Memory).HostVisibleMemory;
    UVar37 = (__return_storage_ptr__->Memory).UnifiedMemory;
    pVVar41 = (PhysicalDevice->m_MemoryProperties).memoryHeaps;
    uVar34 = 0;
    do {
      uVar38 = 1L << ((byte)uVar34 & 0x3f);
      if ((uVar30 >> (uVar34 & 0x3f) & 1) == 0) {
        if ((uVar38 & uVar32) == 0) {
          if ((uVar38 & uVar24) != 0) {
            UVar36 = UVar36 + pVVar41->size;
            (__return_storage_ptr__->Memory).HostVisibleMemory = UVar36;
          }
        }
        else {
          UVar35 = UVar35 + pVVar41->size;
          (__return_storage_ptr__->Memory).LocalMemory = UVar35;
        }
      }
      else {
        UVar37 = UVar37 + pVVar41->size;
        (__return_storage_ptr__->Memory).UnifiedMemory = UVar37;
      }
      uVar34 = uVar34 + 1;
      pVVar41 = pVVar41 + 1;
    } while (uVar40 != uVar34);
  }
  uVar27 = (int)((ulong)((long)(PhysicalDevice->m_QueueFamilyProperties).
                               super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(PhysicalDevice->m_QueueFamilyProperties).
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  uVar26 = 0x10;
  if (uVar27 < 0x10) {
    uVar26 = uVar27;
  }
  __return_storage_ptr__->NumQueues = uVar26;
  if (uVar27 != 0) {
    pUVar42 = __return_storage_ptr__->Queues[0].TextureCopyGranularity + 2;
    lVar28 = 0x14;
    uVar40 = 0;
    do {
      pVVar11 = (PhysicalDevice->m_QueueFamilyProperties).
                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_start;
      CVar20 = VkQueueFlagsToCmdQueueType(*(VkQueueFlags *)((long)pVVar11 + lVar28 + -0x14));
      ((CommandQueueInfo *)(pUVar42 + -4))->QueueType = CVar20;
      pUVar42[-3] = *(Uint32 *)((long)pVVar11 + lVar28 + -0x10);
      pUVar42[-2] = *(Uint32 *)((long)pVVar11 + lVar28 + -8);
      pUVar42[-1] = *(Uint32 *)((long)pVVar11 + lVar28 + -4);
      *pUVar42 = *(Uint32 *)((long)&pVVar11->queueFlags + lVar28);
      uVar40 = uVar40 + 1;
      pUVar42 = pUVar42 + 5;
      lVar28 = lVar28 + 0x18;
    } while (uVar40 < __return_storage_ptr__->NumQueues);
  }
  return __return_storage_ptr__;
}

Assistant:

GraphicsAdapterInfo GetPhysicalDeviceGraphicsAdapterInfo(const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice)
{
    GraphicsAdapterInfo AdapterInfo;

    using ExtensionProperties = VulkanUtilities::VulkanPhysicalDevice::ExtensionProperties;
    using ExtensionFeatures   = VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures;

    const uint32_t                    vkVersion        = PhysicalDevice.GetVkVersion();
    const VkPhysicalDeviceProperties& vkDeviceProps    = PhysicalDevice.GetProperties();
    const ExtensionProperties&        vkDeviceExtProps = PhysicalDevice.GetExtProperties();
    const VkPhysicalDeviceFeatures&   vkFeatures       = PhysicalDevice.GetFeatures();
    const ExtensionFeatures&          vkExtFeatures    = PhysicalDevice.GetExtFeatures();
    const VkPhysicalDeviceLimits&     vkDeviceLimits   = vkDeviceProps.limits;

    // Set graphics adapter properties
    {
        static_assert(_countof(AdapterInfo.Description) <= _countof(vkDeviceProps.deviceName), "");
        for (size_t i = 0; i < _countof(AdapterInfo.Description) - 1 && vkDeviceProps.deviceName[i] != 0; ++i)
            AdapterInfo.Description[i] = vkDeviceProps.deviceName[i];

        AdapterInfo.Type       = VkPhysicalDeviceTypeToAdapterType(vkDeviceProps.deviceType);
        AdapterInfo.Vendor     = VendorIdToAdapterVendor(vkDeviceProps.vendorID);
        AdapterInfo.VendorId   = vkDeviceProps.vendorID;
        AdapterInfo.DeviceId   = vkDeviceProps.deviceID;
        AdapterInfo.NumOutputs = 0;
    }

    // Label all enabled features as optional
    AdapterInfo.Features = VkFeaturesToDeviceFeatures(vkVersion, vkFeatures, vkDeviceProps, vkExtFeatures, vkDeviceExtProps, DEVICE_FEATURE_STATE_OPTIONAL);

    // Buffer properties
    {
        BufferProperties& BufferProps{AdapterInfo.Buffer};
        BufferProps.ConstantBufferOffsetAlignment   = static_cast<Uint32>(vkDeviceLimits.minUniformBufferOffsetAlignment);
        BufferProps.StructuredBufferOffsetAlignment = static_cast<Uint32>(vkDeviceLimits.minStorageBufferOffsetAlignment);
        ASSERT_SIZEOF(BufferProps, 8, "Did you add a new member to BufferProperites? Please initialize it here.");
    }

    // Texture properties
    {
        TextureProperties& TexProps{AdapterInfo.Texture};
        TexProps.MaxTexture1DDimension      = vkDeviceLimits.maxImageDimension1D;
        TexProps.MaxTexture1DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture2DDimension      = vkDeviceLimits.maxImageDimension2D;
        TexProps.MaxTexture2DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture3DDimension      = vkDeviceLimits.maxImageDimension3D;
        TexProps.MaxTextureCubeDimension    = vkDeviceLimits.maxImageDimensionCube;
        TexProps.Texture2DMSSupported       = True;
        TexProps.Texture2DMSArraySupported  = True;
        TexProps.TextureViewSupported       = True;
        TexProps.CubemapArraysSupported     = vkFeatures.imageCubeArray;
        TexProps.TextureView2DOn3DSupported = vkExtFeatures.HasPortabilitySubset ? vkExtFeatures.PortabilitySubset.imageView2DOn3DImage == VK_TRUE : True;
        ASSERT_SIZEOF(TexProps, 32, "Did you add a new member to TextureProperites? Please initialize it here.");
    }

    // Sampler properties
    {
        SamplerProperties& SamProps{AdapterInfo.Sampler};
        SamProps.BorderSamplingModeSupported = True;
        SamProps.MaxAnisotropy               = static_cast<Uint8>(vkDeviceLimits.maxSamplerAnisotropy);
        SamProps.LODBiasSupported            = True;
        ASSERT_SIZEOF(SamProps, 3, "Did you add a new member to SamplerProperites? Please initialize it here.");
    }

    // Ray tracing properties
    if (AdapterInfo.Features.RayTracing)
    {
        const VkPhysicalDeviceRayTracingPipelinePropertiesKHR&    vkRTPipelineProps = vkDeviceExtProps.RayTracingPipeline;
        const VkPhysicalDeviceAccelerationStructurePropertiesKHR& vkASLimits        = vkDeviceExtProps.AccelStruct;

        RayTracingProperties& RayTracingProps{AdapterInfo.RayTracing};
        RayTracingProps.MaxRecursionDepth        = vkRTPipelineProps.maxRayRecursionDepth;
        RayTracingProps.ShaderGroupHandleSize    = vkRTPipelineProps.shaderGroupHandleSize;
        RayTracingProps.MaxShaderRecordStride    = vkRTPipelineProps.maxShaderGroupStride;
        RayTracingProps.ShaderGroupBaseAlignment = vkRTPipelineProps.shaderGroupBaseAlignment;
        RayTracingProps.MaxRayGenThreads         = vkRTPipelineProps.maxRayDispatchInvocationCount;
        RayTracingProps.MaxInstancesPerTLAS      = static_cast<Uint32>(vkASLimits.maxInstanceCount);
        RayTracingProps.MaxPrimitivesPerBLAS     = static_cast<Uint32>(vkASLimits.maxPrimitiveCount);
        RayTracingProps.MaxGeometriesPerBLAS     = static_cast<Uint32>(vkASLimits.maxGeometryCount);
        RayTracingProps.VertexBufferAlignment    = 1;
        RayTracingProps.IndexBufferAlignment     = 1;
        RayTracingProps.TransformBufferAlignment = 16; // from specs
        RayTracingProps.BoxBufferAlignment       = 8;  // from specs
        RayTracingProps.ScratchBufferAlignment   = static_cast<Uint32>(vkASLimits.minAccelerationStructureScratchOffsetAlignment);
        RayTracingProps.InstanceBufferAlignment  = 16; // from specs

        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS;
        if (vkExtFeatures.RayQuery.rayQuery)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING;
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipelineTraceRaysIndirect)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING;
        ASSERT_SIZEOF(RayTracingProps, 60, "Did you add a new member to RayTracingProperites? Please initialize it here.");
    }

    // Wave op properties
    if (AdapterInfo.Features.WaveOp)
    {
        const VkPhysicalDeviceSubgroupProperties& vkWaveProps  = vkDeviceExtProps.Subgroup;
        const VkShaderStageFlags                  WaveOpStages = vkWaveProps.supportedStages;

        VkShaderStageFlags SupportedStages = WaveOpStages & (VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT);
        if (vkFeatures.geometryShader != VK_FALSE)
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_GEOMETRY_BIT;
        if (vkFeatures.tessellationShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
        if (vkExtFeatures.MeshShader.meshShader != VK_FALSE && vkExtFeatures.MeshShader.taskShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TASK_BIT_EXT | VK_SHADER_STAGE_MESH_BIT_EXT);
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline != VK_FALSE)
        {
            constexpr VkShaderStageFlags VK_SHADER_STAGE_ALL_RAY_TRACING =
                VK_SHADER_STAGE_RAYGEN_BIT_KHR |
                VK_SHADER_STAGE_ANY_HIT_BIT_KHR |
                VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR |
                VK_SHADER_STAGE_MISS_BIT_KHR |
                VK_SHADER_STAGE_INTERSECTION_BIT_KHR |
                VK_SHADER_STAGE_CALLABLE_BIT_KHR;
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_ALL_RAY_TRACING;
        }

        WaveOpProperties& WaveOpProps{AdapterInfo.WaveOp};
        WaveOpProps.MinSize         = vkWaveProps.subgroupSize;
        WaveOpProps.MaxSize         = vkWaveProps.subgroupSize;
        WaveOpProps.SupportedStages = VkShaderStageFlagsToShaderTypes(SupportedStages);
        WaveOpProps.Features        = VkSubgroupFeatureFlagsToWaveFeatures(vkWaveProps.supportedOperations);
        ASSERT_SIZEOF(WaveOpProps, 16, "Did you add a new member to WaveOpProperties? Please initialize it here.");
    }

    // Mesh shader properties
    if (AdapterInfo.Features.MeshShaders)
    {
        MeshShaderProperties& MeshProps{AdapterInfo.MeshShader};
        MeshProps.MaxThreadGroupCountX     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[0];
        MeshProps.MaxThreadGroupCountY     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[1];
        MeshProps.MaxThreadGroupCountZ     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[2];
        MeshProps.MaxThreadGroupTotalCount = vkDeviceExtProps.MeshShader.maxMeshWorkGroupTotalCount;
        ASSERT_SIZEOF(MeshProps, 16, "Did you add a new member to MeshShaderProperties? Please initialize it here.");
    }

    // Compute shader properties
    {
        ComputeShaderProperties& CompProps{AdapterInfo.ComputeShader};
        CompProps.SharedMemorySize          = vkDeviceProps.limits.maxComputeSharedMemorySize;
        CompProps.MaxThreadGroupInvocations = vkDeviceProps.limits.maxComputeWorkGroupInvocations;
        CompProps.MaxThreadGroupSizeX       = vkDeviceProps.limits.maxComputeWorkGroupSize[0];
        CompProps.MaxThreadGroupSizeY       = vkDeviceProps.limits.maxComputeWorkGroupSize[1];
        CompProps.MaxThreadGroupSizeZ       = vkDeviceProps.limits.maxComputeWorkGroupSize[2];
        CompProps.MaxThreadGroupCountX      = vkDeviceProps.limits.maxComputeWorkGroupCount[0];
        CompProps.MaxThreadGroupCountY      = vkDeviceProps.limits.maxComputeWorkGroupCount[1];
        CompProps.MaxThreadGroupCountZ      = vkDeviceProps.limits.maxComputeWorkGroupCount[2];
        ASSERT_SIZEOF(CompProps, 32, "Did you add a new member to ComputeShaderProperties? Please initialize it here.");
    }

    // Shading rate properties
    if (AdapterInfo.Features.VariableRateShading)
    {
        ShadingRateProperties& ShadingRateProps{AdapterInfo.ShadingRate};

        // VK_KHR_fragment_shading_rate
        if (vkExtFeatures.ShadingRate.pipelineFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.primitiveFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
        {
            auto SetShadingRateCap = [&ShadingRateProps](VkBool32 vkFlag, SHADING_RATE_CAP_FLAGS CapFlag) {
                if (vkFlag != VK_FALSE)
                    ShadingRateProps.CapFlags |= CapFlag;
            };

            // clang-format off
            SetShadingRateCap(vkExtFeatures.ShadingRate.pipelineFragmentShadingRate,                          SHADING_RATE_CAP_FLAG_PER_DRAW);
            SetShadingRateCap(vkExtFeatures.ShadingRate.primitiveFragmentShadingRate,                         SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
            SetShadingRateCap(vkExtFeatures.ShadingRate.attachmentFragmentShadingRate,                        SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithSampleMask,                 SHADING_RATE_CAP_FLAG_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderSampleMask,           SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderDepthStencilWrites,   SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.primitiveFragmentShadingRateWithMultipleViewports, SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.layeredShadingRateAttachments,                     SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY);
            // clang-format on

            if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            // Always enabled in Vulkan
            ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_SHADING_RATE_SHADER_INPUT;

            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;

            if (vkDeviceExtProps.ShadingRate.fragmentShadingRateNonTrivialCombinerOps != VK_FALSE)
            {
                ShadingRateProps.Combiners |= SHADING_RATE_COMBINER_MIN | SHADING_RATE_COMBINER_MAX;
                ShadingRateProps.Combiners |= (vkDeviceExtProps.ShadingRate.fragmentShadingRateStrictMultiplyCombiner != VK_FALSE) ?
                    SHADING_RATE_COMBINER_MUL :
                    SHADING_RATE_COMBINER_SUM;
            }
            if (vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
            {
                ShadingRateProps.Format         = SHADING_RATE_FORMAT_PALETTE;
                ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.height;
                ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.height;
            }

            std::vector<VkPhysicalDeviceFragmentShadingRateKHR> ShadingRates;
#if DILIGENT_USE_VOLK
            {
                Uint32 ShadingRateCount = 0;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, nullptr);
                VERIFY_EXPR(ShadingRateCount >= 3); // Spec says that implementation must support at least 3 predefined modes.

                ShadingRates.resize(ShadingRateCount);
                for (VkPhysicalDeviceFragmentShadingRateKHR& SR : ShadingRates)
                    SR.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, ShadingRates.data());
            }
#else
            UNSUPPORTED("vkGetPhysicalDeviceFragmentShadingRatesKHR is only available through Volk");
#endif
            constexpr VkSampleCountFlags VK_SAMPLE_COUNT_ALL = (VK_SAMPLE_COUNT_64_BIT << 1) - 1;

            ShadingRateProps.NumShadingRates = StaticCast<Uint8>(std::min(ShadingRates.size(), size_t{MAX_SHADING_RATES}));
            for (Uint32 i = 0; i < ShadingRateProps.NumShadingRates; ++i)
            {
                const VkPhysicalDeviceFragmentShadingRateKHR& Src = ShadingRates[i];
                ShadingRateMode&                              Dst = ShadingRateProps.ShadingRates[i];

                // maxFragmentShadingRateRasterizationSamples - contains only maximum bit
                // sampleCounts - contains all supported bits
                VERIFY_EXPR((Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) ||
                            (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1)));

                Dst.SampleBits = VkSampleCountFlagsToSampleCount(Src.sampleCounts & VK_SAMPLE_COUNT_ALL);
                Dst.Rate       = VkFragmentSizeToShadingRate(Src.fragmentSize);
            }
        }
        // VK_EXT_fragment_density_map
        else if (vkExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
        {
            ShadingRateProps.Format    = SHADING_RATE_FORMAT_UNORM8;
            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;
            ShadingRateProps.CapFlags =
                SHADING_RATE_CAP_FLAG_TEXTURE_BASED |
                SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS |
                SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapDynamic != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_GPU;
            else if (vkExtFeatures.FragmentDensityMap2.fragmentDensityMapDeferred != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT;
            else
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV;

            if (vkDeviceExtProps.FragmentDensityMap.fragmentDensityInvocations != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapNonSubsampledImages != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            ShadingRateProps.MaxSabsampledArraySlices = vkDeviceExtProps.FragmentDensityMap2.maxSubsampledArrayLayers; // zero if VK_EXT_fragment_density_map2 is not supported

            ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.width;
            ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.height;
            ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.width;
            ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.height;

            ShadingRateProps.NumShadingRates            = 1;
            ShadingRateProps.ShadingRates[0].Rate       = SHADING_RATE_1X1;
            ShadingRateProps.ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
        }

        // Get supported bind flags
        if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
        {
            VkFormat          vkSRTexFormat = VK_FORMAT_UNDEFINED;
            VkImageUsageFlags vkSRTexUsage  = 0;
            if (ShadingRateProps.Format == SHADING_RATE_FORMAT_UNORM8)
            {
                vkSRTexFormat = VK_FORMAT_R8G8_UNORM;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_DENSITY_MAP_BIT_EXT;
            }
            else
            {
                vkSRTexFormat = VK_FORMAT_R8_UINT;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
            }

            auto TestImageUsage = [&](VkImageUsageFlags Usage) {
                VkImageFormatProperties ImgFmtProps{};

                VkResult err = vkGetPhysicalDeviceImageFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL,
                                                                        vkSRTexUsage | Usage, 0, &ImgFmtProps);
                return err == VK_SUCCESS;
            };

            VkFormatProperties vkFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, &vkFmtProps);
            VERIFY_EXPR(vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT));

            ShadingRateProps.BindFlags = BIND_SHADING_RATE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_SAMPLED_BIT))
                ShadingRateProps.BindFlags |= BIND_SHADER_RESOURCE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_STORAGE_BIT))
                ShadingRateProps.BindFlags |= BIND_UNORDERED_ACCESS;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT))
                ShadingRateProps.BindFlags |= BIND_RENDER_TARGET;
        }

        ASSERT_SIZEOF(ShadingRateProps, 52, "Did you add a new member to ShadingRateProperties? Please initialize it here.");
    }

    // Draw command properties
    {
        DrawCommandProperties& DrawCommandProps{AdapterInfo.DrawCommand};
        DrawCommandProps.MaxIndexValue        = vkDeviceProps.limits.maxDrawIndexedIndexValue;
        DrawCommandProps.MaxDrawIndirectCount = vkDeviceProps.limits.maxDrawIndirectCount;
        DrawCommandProps.CapFlags             = DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT | DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
        if (vkFeatures.multiDrawIndirect != VK_FALSE || vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT;
        if (vkFeatures.drawIndirectFirstInstance != VK_FALSE)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE;
        if (vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER;
        ASSERT_SIZEOF(DrawCommandProps, 12, "Did you add a new member to DrawCommandProperties? Please initialize it here.");
    }

    // Sparse memory properties
    if (AdapterInfo.Features.SparseResources)
    {
        // Same check as in VkFeaturesToDeviceFeatures()
        VERIFY_EXPR(vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D));

        const VkPhysicalDeviceSparseProperties& SparseProps{vkDeviceProps.sparseProperties};
        SparseResourceProperties&               SparseRes{AdapterInfo.SparseResources};
        SparseRes.AddressSpaceSize  = vkDeviceLimits.sparseAddressSpaceSize;
        SparseRes.ResourceSpaceSize = vkDeviceLimits.sparseAddressSpaceSize; // no way to query
        SparseRes.StandardBlockSize = 64u << 10;                             // docs: "All currently defined standard sparse image block shapes are 64 KB in size."

        SparseRes.BufferBindFlags =
            BIND_VERTEX_BUFFER |
            BIND_INDEX_BUFFER |
            BIND_UNIFORM_BUFFER |
            BIND_SHADER_RESOURCE |
            BIND_UNORDERED_ACCESS |
            BIND_INDIRECT_DRAW_ARGS |
            BIND_RAY_TRACING;

        SparseRes.CapFlags |=
            SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE |
            SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT;

        auto SetSparseResCap = [&SparseRes](VkBool32 Feature, SPARSE_RESOURCE_CAP_FLAGS Flag) {
            if (Feature != VK_FALSE)
                SparseRes.CapFlags |= Flag;
        };
        // clang-format off
        SetSparseResCap(SparseProps.residencyStandard2DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_2D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyStandard2DMultisampleBlockShape, SPARSE_RESOURCE_CAP_FLAG_STANDARD_2DMS_TILE_SHAPE );
        SetSparseResCap(SparseProps.residencyStandard3DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_3D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyAlignedMipSize,                  SPARSE_RESOURCE_CAP_FLAG_ALIGNED_MIP_SIZE         );
        SetSparseResCap(SparseProps.residencyNonResidentStrict,               SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_STRICT      );
        SetSparseResCap(vkFeatures.shaderResourceResidency,                   SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY);
        SetSparseResCap(vkFeatures.sparseResidencyBuffer,                     SPARSE_RESOURCE_CAP_FLAG_BUFFER                   );
        SetSparseResCap(vkFeatures.sparseResidencyImage2D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL);
        SetSparseResCap(vkFeatures.sparseResidencyImage3D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D               );
        SetSparseResCap(vkFeatures.sparseResidency2Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency4Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency8Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency16Samples,                  SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES       );
        SetSparseResCap(vkFeatures.sparseResidencyAliased,                    SPARSE_RESOURCE_CAP_FLAG_ALIASED                  );
        // clang-format on

        ASSERT_SIZEOF(SparseRes, 32, "Did you add a new member to SparseResourceProperties? Please initialize it here.");
    }

    // Set memory properties
    {
        AdapterMemoryInfo& Mem{AdapterInfo.Memory};
        Mem.LocalMemory         = 0;
        Mem.HostVisibleMemory   = 0;
        Mem.UnifiedMemory       = 0;
        Mem.MaxMemoryAllocation = vkDeviceExtProps.Maintenance3.maxMemoryAllocationSize;

        std::bitset<VK_MAX_MEMORY_HEAPS> DeviceLocalHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> HostVisibleHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> UnifiedHeap;

        const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
        for (uint32_t type = 0; type < MemoryProps.memoryTypeCount; ++type)
        {
            const VkMemoryType&             MemTypeInfo        = MemoryProps.memoryTypes[type];
            constexpr VkMemoryPropertyFlags UnifiedMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT | VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

            if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT)
            {
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL | BIND_INPUT_ATTACHMENT;
            }
            else if ((MemTypeInfo.propertyFlags & UnifiedMemoryFlags) == UnifiedMemoryFlags)
            {
                UnifiedHeap[MemTypeInfo.heapIndex] = true;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_WRITE;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_CACHED_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_READ;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
            {
                DeviceLocalHeap[MemTypeInfo.heapIndex] = true;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT)
            {
                HostVisibleHeap[MemTypeInfo.heapIndex] = true;
            }

            // In Metal, input attachment with memoryless texture must be used as an imageblock,
            // which is not supported in SPIRV to MSL translator.
#if PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS
            if (Mem.MemorylessTextureBindFlags != 0)
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL;
#endif
        }

        for (uint32_t heap = 0; heap < MemoryProps.memoryHeapCount; ++heap)
        {
            const VkMemoryHeap& HeapInfo = MemoryProps.memoryHeaps[heap];

            if (UnifiedHeap[heap])
                Mem.UnifiedMemory += static_cast<Uint64>(HeapInfo.size);
            else if (DeviceLocalHeap[heap])
                Mem.LocalMemory += static_cast<Uint64>(HeapInfo.size);
            else if (HostVisibleHeap[heap])
                Mem.HostVisibleMemory += static_cast<Uint64>(HeapInfo.size);
        }

        ASSERT_SIZEOF(Mem, 40, "Did you add a new member to AdapterMemoryInfo? Please initialize it here.");
    }

    // Set queue info
    {
        const auto& QueueProperties = PhysicalDevice.GetQueueProperties();
        AdapterInfo.NumQueues       = std::min(MAX_ADAPTER_QUEUES, static_cast<Uint32>(QueueProperties.size()));

        for (Uint32 q = 0; q < AdapterInfo.NumQueues; ++q)
        {
            const VkQueueFamilyProperties& SrcQueue = QueueProperties[q];
            CommandQueueInfo&              DstQueue = AdapterInfo.Queues[q];

            DstQueue.QueueType                 = VkQueueFlagsToCmdQueueType(SrcQueue.queueFlags);
            DstQueue.MaxDeviceContexts         = SrcQueue.queueCount;
            DstQueue.TextureCopyGranularity[0] = SrcQueue.minImageTransferGranularity.width;
            DstQueue.TextureCopyGranularity[1] = SrcQueue.minImageTransferGranularity.height;
            DstQueue.TextureCopyGranularity[2] = SrcQueue.minImageTransferGranularity.depth;
        }
    }

    return AdapterInfo;
}